

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

int fl_utf_toupper(uchar *str,int len,char *buf)

{
  uint uVar1;
  wchar_t wVar2;
  uint u1;
  int l2;
  int l1;
  char *end;
  int l;
  int i;
  char *buf_local;
  uchar *puStack_10;
  int len_local;
  uchar *str_local;
  
  end._0_4_ = 0;
  _l2 = str + len;
  end._4_4_ = 0;
  _l = buf;
  buf_local._4_4_ = len;
  puStack_10 = str;
  while (end._4_4_ < buf_local._4_4_) {
    uVar1 = fl_utf8decode((char *)(puStack_10 + end._4_4_),(char *)_l2,(wchar_t *)&u1);
    uVar1 = Toupper(uVar1);
    wVar2 = fl_utf8encode(uVar1,_l + (int)end);
    if ((int)u1 < 1) {
      end._4_4_ = end._4_4_ + 1;
    }
    else {
      end._4_4_ = u1 + end._4_4_;
    }
    if (wVar2 < L'\x01') {
      end._0_4_ = (int)end + 1;
    }
    else {
      end._0_4_ = wVar2 + (int)end;
    }
  }
  return (int)end;
}

Assistant:

int fl_utf_toupper(const unsigned char *str, int len, char *buf)
{
  int i;
  int l = 0;
  char *end = (char *)&str[len];
  for (i = 0; i < len;) {
    int l1, l2;
    unsigned int u1;

    u1 = fl_utf8decode((const char*)(str + i), end, &l1);
    l2 = fl_utf8encode((unsigned int) Toupper(u1), buf + l);
    if (l1 < 1) {
      i += 1;
    } else {
      i += l1;
    }
    if (l2 < 1) {
      l += 1;
    } else {
      l += l2;
    }
  }
  return l;
}